

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  long lVar1;
  Proto *p;
  int lastpc;
  char *pcVar2;
  StkId pSVar3;
  int reg;
  char *kind;
  long lVar4;
  char *local_28;
  
  ci = L->ci;
  local_28 = (char *)0x0;
  if ((ci->callstatus & 2) == 0) {
    pSVar3 = (ci->func).p;
    lVar1 = *(long *)pSVar3;
    for (lVar4 = 0; (ulong)*(byte *)(lVar1 + 10) * 8 != lVar4; lVar4 = lVar4 + 8) {
      if (*(TValue **)(*(long *)(lVar1 + 0x20 + lVar4) + 0x10) == o) {
        lVar1 = *(long *)(*(long *)(*(long *)(lVar1 + 0x18) + 0x50) + lVar4 * 2);
        pcVar2 = "?";
        if (lVar1 != 0) {
          pcVar2 = (char *)(lVar1 + 0x18);
        }
        kind = "upvalue";
        goto LAB_0010fdaa;
      }
    }
    reg = 0;
    while (pSVar3 = pSVar3 + 1, pSVar3 < (ci->top).p) {
      if (pSVar3 == (StkId)o) {
        p = *(Proto **)(lVar1 + 0x18);
        lastpc = currentpc(ci);
        kind = getobjname(p,lastpc,reg,&local_28);
        pcVar2 = local_28;
        goto LAB_0010fdaa;
      }
      reg = reg + 1;
    }
  }
  pcVar2 = (char *)0x0;
  kind = (char *)0x0;
LAB_0010fdaa:
  pcVar2 = formatvarinfo(L,kind,pcVar2);
  return pcVar2;
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind) {  /* not an upvalue? */
      int reg = instack(ci, o);  /* try a register */
      if (reg >= 0)  /* is 'o' a register? */
        kind = getobjname(ci_func(ci)->p, currentpc(ci), reg, &name);
    }
  }
  return formatvarinfo(L, kind, name);
}